

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedMixNameAndNumberEditions_Test
::~ParseErrorTest_EnumReservedMixNameAndNumberEditions_Test
          (ParseErrorTest_EnumReservedMixNameAndNumberEditions_Test *this)

{
  ParseErrorTest_EnumReservedMixNameAndNumberEditions_Test *this_local;
  
  ~ParseErrorTest_EnumReservedMixNameAndNumberEditions_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedMixNameAndNumberEditions) {
  ExpectHasErrors(
      "edition = \"2023\";\n"
      "enum TestEnum {\n"
      "  FOO = 1;\n"
      "  reserved 10, foo;\n"
      "}\n",
      "3:15: Expected enum number range.\n");
}